

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O1

float __thiscall Timer::toc(Timer *this)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar1 = (lVar1 - (this->begin).__d.__r) / 1000000 + (this->duration).__r;
  (this->duration).__r = lVar1;
  return (float)lVar1 / 1000.0;
}

Assistant:

float Timer::toc() {
  duration += std::chrono::duration_cast<std::chrono::milliseconds>
              (std::chrono::high_resolution_clock::now()-begin);
  return get();
}